

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# general_names_unittest.cc
# Opt level: O0

void __thiscall
bssl::GeneralNames_IPAddress_v6_Test::~GeneralNames_IPAddress_v6_Test
          (GeneralNames_IPAddress_v6_Test *this)

{
  GeneralNames_IPAddress_v6_Test *this_local;
  
  ~GeneralNames_IPAddress_v6_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(GeneralNames, IPAddress_v6) {
  std::string san_der;
  ASSERT_TRUE(LoadTestSubjectAltNameData("san-ipaddress6.pem", &san_der));

  CertErrors errors;
  std::unique_ptr<GeneralNames> general_names =
      GeneralNames::Create(StringAsBytes(san_der), &errors);
  ASSERT_TRUE(general_names);
  EXPECT_EQ(GENERAL_NAME_IP_ADDRESS, general_names->present_name_types);
  ASSERT_EQ(1U, general_names->ip_addresses.size());
  static const uint8_t kIP[] = {0xFE, 0x80, 1, 2,  3,  4,  5,  6,
                                7,    8,    9, 10, 11, 12, 13, 14};
  EXPECT_EQ(der::Input(kIP), general_names->ip_addresses[0]);
  EXPECT_EQ(0U, general_names->ip_address_ranges.size());
}